

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_manifold(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL pRVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  REF_INT local_2098;
  REF_INT local_2094;
  int local_2090;
  REF_INT local_2088;
  REF_INT local_2080;
  int local_207c;
  REF_INT local_2078;
  REF_INT local_2074;
  int local_2070;
  REF_INT local_206c;
  REF_INT local_2068;
  int local_2064;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_BOOL shared;
  REF_BOOL already_have_it;
  REF_INT i1;
  REF_INT i0;
  REF_INT i;
  REF_INT node_list1 [1000];
  int local_108c;
  REF_INT local_1088;
  REF_INT nnode1;
  REF_INT node_list0 [1000];
  int local_e0;
  int local_dc;
  REF_INT nnode0;
  REF_INT nsafe;
  REF_INT safe_list [4];
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL will_be_collapsed;
  REF_INT new_cell;
  REF_INT node;
  REF_INT nodes [27];
  int local_34;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  *allowed = 0;
  pRVar1 = ref_grid->cell[8];
  if ((node1 < 0) || (pRVar1->ref_adj->nnode <= node1)) {
    local_2064 = -1;
  }
  else {
    local_2064 = pRVar1->ref_adj->first[node1];
  }
  local_34 = local_2064;
  if (local_2064 == -1) {
    local_2068 = -1;
  }
  else {
    local_2068 = pRVar1->ref_adj->item[local_2064].ref;
  }
  nodes[0x1a] = local_2068;
  while (local_34 != -1) {
    uVar3 = ref_cell_nodes(pRVar1,nodes[0x1a],&new_cell);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x1c9,"ref_collapse_edge_manifold",(ulong)uVar3,"nodes");
      return uVar3;
    }
    bVar4 = false;
    for (will_be_collapsed = 0; will_be_collapsed < pRVar1->node_per;
        will_be_collapsed = will_be_collapsed + 1) {
      if (node0 == (&new_cell)[will_be_collapsed]) {
        bVar4 = true;
      }
    }
    if (!bVar4) {
      for (will_be_collapsed = 0; will_be_collapsed < pRVar1->node_per;
          will_be_collapsed = will_be_collapsed + 1) {
        if (node1 == (&new_cell)[will_be_collapsed]) {
          (&new_cell)[will_be_collapsed] = node0;
        }
      }
      uVar3 = ref_cell_with(pRVar1,&new_cell,&ref_private_macro_code_rss);
      if ((uVar3 != 0) && (uVar3 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x1d4,"ref_collapse_edge_manifold",(ulong)uVar3,"with node0 failed");
        return uVar3;
      }
      if (ref_private_macro_code_rss != -1) {
        *allowed = 0;
        return 0;
      }
    }
    local_34 = pRVar1->ref_adj->item[local_34].next;
    if (local_34 == -1) {
      local_206c = -1;
    }
    else {
      local_206c = pRVar1->ref_adj->item[local_34].ref;
    }
    nodes[0x1a] = local_206c;
  }
  pRVar1 = ref_grid->cell[3];
  if ((node1 < 0) || (pRVar1->ref_adj->nnode <= node1)) {
    local_2070 = -1;
  }
  else {
    local_2070 = pRVar1->ref_adj->first[node1];
  }
  local_34 = local_2070;
  if (local_2070 == -1) {
    local_2074 = -1;
  }
  else {
    local_2074 = pRVar1->ref_adj->item[local_2070].ref;
  }
  nodes[0x1a] = local_2074;
  while (local_34 != -1) {
    uVar3 = ref_cell_nodes(pRVar1,nodes[0x1a],&new_cell);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x1de,"ref_collapse_edge_manifold",(ulong)uVar3,"nodes");
      return uVar3;
    }
    bVar4 = false;
    for (will_be_collapsed = 0; will_be_collapsed < pRVar1->node_per;
        will_be_collapsed = will_be_collapsed + 1) {
      if (node0 == (&new_cell)[will_be_collapsed]) {
        bVar4 = true;
      }
    }
    if (!bVar4) {
      for (will_be_collapsed = 0; will_be_collapsed < pRVar1->node_per;
          will_be_collapsed = will_be_collapsed + 1) {
        if (node1 == (&new_cell)[will_be_collapsed]) {
          (&new_cell)[will_be_collapsed] = node0;
        }
      }
      safe_list[3] = ref_cell_with(pRVar1,&new_cell,&ref_private_macro_code_rss);
      if ((safe_list[3] != 0) && (safe_list[3] != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x1e9,"ref_collapse_edge_manifold",(ulong)(uint)safe_list[3],"with node0 failed");
        return safe_list[3];
      }
      if (ref_private_macro_code_rss != -1) {
        *allowed = 0;
        return 0;
      }
    }
    local_34 = pRVar1->ref_adj->item[local_34].next;
    if (local_34 == -1) {
      local_2078 = -1;
    }
    else {
      local_2078 = pRVar1->ref_adj->item[local_34].ref;
    }
    nodes[0x1a] = local_2078;
  }
  pRVar1 = ref_grid->cell[3];
  local_dc = 0;
  nnode0 = -1;
  nsafe = -1;
  safe_list[0] = -1;
  safe_list[1] = -1;
  if ((node1 < 0) || (pRVar1->ref_adj->nnode <= node1)) {
    local_207c = -1;
  }
  else {
    local_207c = pRVar1->ref_adj->first[node1];
  }
  local_34 = local_207c;
  if (local_207c == -1) {
    local_2080 = -1;
  }
  else {
    local_2080 = pRVar1->ref_adj->item[local_207c].ref;
  }
  nodes[0x1a] = local_2080;
  while (local_34 != -1) {
    uVar3 = ref_cell_nodes(pRVar1,nodes[0x1a],&new_cell);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x201,"ref_collapse_edge_manifold",(ulong)uVar3,"nodes");
      return uVar3;
    }
    bVar4 = false;
    for (will_be_collapsed = 0; will_be_collapsed < pRVar1->node_per;
        will_be_collapsed = will_be_collapsed + 1) {
      if (node0 == (&new_cell)[will_be_collapsed]) {
        bVar4 = true;
      }
    }
    if (bVar4) {
      for (will_be_collapsed = 0; will_be_collapsed < pRVar1->node_per;
          will_be_collapsed = will_be_collapsed + 1) {
        bVar4 = false;
        for (i1 = 0; i1 < local_dc; i1 = i1 + 1) {
          bVar2 = !bVar4;
          bVar4 = true;
          if (bVar2) {
            bVar4 = (&new_cell)[will_be_collapsed] == (&nnode0)[i1];
          }
        }
        if (!bVar4) {
          if (3 < local_dc) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x20d,"ref_collapse_edge_manifold","more than four remove tri nodes");
            return 1;
          }
          (&nnode0)[local_dc] = (&new_cell)[will_be_collapsed];
          local_dc = local_dc + 1;
        }
      }
    }
    local_34 = pRVar1->ref_adj->item[local_34].next;
    if (local_34 == -1) {
      local_2088 = -1;
    }
    else {
      local_2088 = pRVar1->ref_adj->item[local_34].ref;
    }
    nodes[0x1a] = local_2088;
  }
  if (((local_dc != 0) && (local_dc != 3)) && (local_dc != 4)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           0x215,"ref_collapse_edge_manifold","nsafe not 3-non manifold or 4-manifold");
    return 1;
  }
  if ((local_dc == 3) || (local_dc == 4)) {
    uVar3 = ref_cell_node_list_around(pRVar1,node0,1000,&local_e0,&local_1088);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x21a,"ref_collapse_edge_manifold",(ulong)uVar3,"node0 list");
      return uVar3;
    }
    uVar3 = ref_cell_node_list_around(pRVar1,node1,1000,&local_108c,&i0);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x21d,"ref_collapse_edge_manifold",(ulong)uVar3,"node1 list");
      return uVar3;
    }
    for (already_have_it = 0; already_have_it < local_e0; already_have_it = already_have_it + 1) {
      for (shared = 0; shared < local_108c; shared = shared + 1) {
        if ((&local_1088)[already_have_it] == (&i0)[shared]) {
          bVar4 = true;
          for (i1 = 0; i1 < local_dc; i1 = i1 + 1) {
            bVar2 = false;
            if (bVar4) {
              bVar2 = (&local_1088)[already_have_it] != (&nnode0)[i1];
            }
            bVar4 = bVar2;
          }
          if (bVar4) {
            *allowed = 0;
            return 0;
          }
        }
      }
    }
  }
  pRVar1 = ref_grid->cell[0];
  if ((node1 < 0) || (pRVar1->ref_adj->nnode <= node1)) {
    local_2090 = -1;
  }
  else {
    local_2090 = pRVar1->ref_adj->first[node1];
  }
  local_34 = local_2090;
  if (local_2090 == -1) {
    local_2094 = -1;
  }
  else {
    local_2094 = pRVar1->ref_adj->item[local_2090].ref;
  }
  nodes[0x1a] = local_2094;
  while( true ) {
    if (local_34 == -1) {
      *allowed = 1;
      return 0;
    }
    uVar3 = ref_cell_nodes(pRVar1,nodes[0x1a],&new_cell);
    if (uVar3 != 0) break;
    bVar4 = false;
    for (will_be_collapsed = 0; will_be_collapsed < pRVar1->node_per;
        will_be_collapsed = will_be_collapsed + 1) {
      if (node0 == (&new_cell)[will_be_collapsed]) {
        bVar4 = true;
      }
    }
    if (!bVar4) {
      for (will_be_collapsed = 0; will_be_collapsed < pRVar1->node_per;
          will_be_collapsed = will_be_collapsed + 1) {
        if (node1 == (&new_cell)[will_be_collapsed]) {
          (&new_cell)[will_be_collapsed] = node0;
        }
      }
      uVar3 = ref_cell_with(pRVar1,&new_cell,&ref_private_macro_code_rss);
      if ((uVar3 != 0) && (uVar3 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x23d,"ref_collapse_edge_manifold",(ulong)uVar3,"with node0 failed");
        return uVar3;
      }
      if (ref_private_macro_code_rss != -1) {
        *allowed = 0;
        return 0;
      }
    }
    local_34 = pRVar1->ref_adj->item[local_34].next;
    if (local_34 == -1) {
      local_2098 = -1;
    }
    else {
      local_2098 = pRVar1->ref_adj->item[local_34].ref;
    }
    nodes[0x1a] = local_2098;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x232,
         "ref_collapse_edge_manifold",(ulong)uVar3,"nodes");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_manifold(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1,
                                              REF_BOOL *allowed) {
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, new_cell;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  { /* ensure the tri node neighbors shared by node0 and node1 are
       involved in the collapse (i.e. there are no new connections to
       created) */
    REF_INT safe_list[4], nsafe;
    REF_INT nnode0, node_list0[MAX_NODE_LIST];
    REF_INT nnode1, node_list1[MAX_NODE_LIST];
    REF_INT i, i0, i1;
    REF_BOOL already_have_it, shared;

    nsafe = 0;
    safe_list[0] = REF_EMPTY;
    safe_list[1] = REF_EMPTY;
    safe_list[2] = REF_EMPTY;
    safe_list[3] = REF_EMPTY;
    each_ref_cell_having_node(ref_cell, node1, item, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

      will_be_collapsed = REF_FALSE;
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
      if (will_be_collapsed) {
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          already_have_it = REF_FALSE;
          for (i = 0; i < nsafe; i++) {
            already_have_it = already_have_it || (nodes[node] == safe_list[i]);
          }
          if (!already_have_it) {
            RAS(nsafe < 4, "more than four remove tri nodes");
            safe_list[nsafe] = nodes[node];
            nsafe++;
          }
        }
      }
    }
    RAS(0 == nsafe || 3 == nsafe || 4 == nsafe,
        "nsafe not 3-non manifold or 4-manifold");

    if (3 == nsafe || 4 == nsafe) {
      RSS(ref_cell_node_list_around(ref_cell, node0, MAX_NODE_LIST, &nnode0,
                                    node_list0),
          "node0 list");
      RSS(ref_cell_node_list_around(ref_cell, node1, MAX_NODE_LIST, &nnode1,
                                    node_list1),
          "node1 list");
      for (i0 = 0; i0 < nnode0; i0++) {
        for (i1 = 0; i1 < nnode1; i1++) {
          if (node_list0[i0] == node_list1[i1]) {
            shared = REF_TRUE;
            for (i = 0; i < nsafe; i++) {
              shared = shared && (node_list0[i0] != safe_list[i]);
            }
            if (shared) {
              *allowed = REF_FALSE;
              return REF_SUCCESS;
            }
          }
        }
      }
    }
  }

  ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;

    RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
        "with node0 failed");
    if (REF_EMPTY != new_cell) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}